

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::writeVariationalLowerBound
          (VariationalBayesEstimatorOnLDA *this,string *VLBFilename,string *VLBTimeSeriesFilename)

{
  long lVar1;
  undefined8 uVar2;
  ostream *poVar3;
  pointer pdVar4;
  ulong uVar5;
  ofstream VLBTimeSeriesOutput;
  ofstream VLBOutput;
  long local_428;
  filebuf local_420 [240];
  ios_base aiStack_330 [264];
  long local_228;
  filebuf local_220 [240];
  ios_base aiStack_130 [264];
  
  std::ofstream::ofstream(&local_228);
  std::ofstream::ofstream(&local_428);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)VLBFilename);
  std::ofstream::open((string *)&local_428,(_Ios_Openmode)VLBTimeSeriesFilename);
  *(undefined8 *)(local_220 + *(long *)(local_228 + -0x18)) = 0x11;
  poVar3 = std::ostream::_M_insert<double>(this->_variationalLowerBound);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  *(undefined8 *)(local_420 + *(long *)(local_428 + -0x18)) = 0x11;
  pdVar4 = (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    uVar5 = 0;
    do {
      std::ostream::_M_insert<double>(pdVar4[uVar5]);
      std::ios::widen((char)*(undefined8 *)(local_428 + -0x18) + (char)&local_428);
      std::ostream::put((char)&local_428);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      pdVar4 = (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->_VLBTimeSeries).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
  }
  std::ofstream::close();
  std::ofstream::close();
  uVar2 = _error_with_option_name;
  lVar1 = _VTT;
  local_428 = _VTT;
  *(undefined8 *)(local_420 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_420);
  std::ios_base::~ios_base(aiStack_330);
  local_228 = lVar1;
  *(undefined8 *)(local_220 + *(long *)(lVar1 + -0x18) + -8) = uVar2;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(aiStack_130);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::writeVariationalLowerBound(string VLBFilename, string VLBTimeSeriesFilename)const{//{{{
    ofstream VLBOutput;
    ofstream VLBTimeSeriesOutput;
    VLBOutput.open(VLBFilename, ios::out);
    VLBTimeSeriesOutput.open(VLBTimeSeriesFilename, ios::out);

    VLBOutput<<setprecision(numeric_limits<double>::max_digits10);
    VLBOutput<<_variationalLowerBound<<endl;
    VLBTimeSeriesOutput<<std::setprecision(std::numeric_limits<double>::max_digits10);
    for(int i=0;i<_VLBTimeSeries.size();i++){
        VLBTimeSeriesOutput<<_VLBTimeSeries[i];
        VLBTimeSeriesOutput<<endl;
    }
    VLBOutput.close();
    VLBTimeSeriesOutput.close();
}